

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDFace * __thiscall ON_SubDEdgePtr::RelativeFace(ON_SubDEdgePtr *this,int relative_face_index)

{
  ulong uVar1;
  ON_SubDFace *pOVar2;
  ON_SubDFace *pOVar3;
  ON_SubDFace *pOVar4;
  ON_SubDFace *pOVar5;
  ulong uVar6;
  ulong uVar7;
  ON_SubDFace *pOVar8;
  ON_SubDFace *LR [2];
  
  if ((uint)relative_face_index < 2) {
    uVar6 = this->m_ptr & 0xfffffffffffffff8;
    if (uVar6 != 0) {
      pOVar5 = (ON_SubDFace *)0x0;
      if ((ulong)*(ushort *)(uVar6 + 100) < 3) {
        LR[0] = (ON_SubDFace *)0x0;
        pOVar5 = (ON_SubDFace *)0x0;
        for (uVar7 = 0; *(ushort *)(uVar6 + 100) != uVar7; uVar7 = uVar7 + 1) {
          uVar1 = *(ulong *)(uVar6 + 0x68 + uVar7 * 8);
          pOVar8 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
          if (pOVar8 != (ON_SubDFace *)0x0) {
            pOVar3 = pOVar8;
            pOVar4 = pOVar5;
            pOVar2 = LR[0];
            if ((uVar1 & 1) == 0) {
              pOVar3 = LR[0];
              pOVar4 = pOVar8;
              pOVar2 = pOVar5;
            }
            pOVar5 = pOVar4;
            LR[0] = pOVar3;
            if (pOVar2 != (ON_SubDFace *)0x0) {
              return (ON_SubDFace *)0x0;
            }
          }
        }
        uVar6 = (ulong)(1 - relative_face_index);
        if ((this->m_ptr & 1) == 0) {
          uVar6 = (ulong)(uint)relative_face_index;
        }
        pOVar5 = LR[uVar6 - 1];
      }
      return pOVar5;
    }
  }
  return (ON_SubDFace *)0x0;
}

Assistant:

const class ON_SubDFace* ON_SubDEdgePtr::RelativeFace(
  int relative_face_index
) const
{
  if (relative_face_index < 0 || relative_face_index > 1)
    return nullptr; // invalid input
  
  const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_ptr);
  if (nullptr == e )
    return nullptr; // null input

  if (nullptr == e || e->m_face_count > 2)
    return nullptr; // nonmanifold edge

  const ON_SubDFace* LR[2] = {};
  for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
  {
    const ON__UINT_PTR ptr = e->m_face2[efi].m_ptr;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(ptr);
    if (nullptr == f)
      continue;
    if (0 == ON_SUBD_FACE_DIRECTION(ptr))
    {
      if (nullptr != LR[0])
        return nullptr; // not an oriented manifold interior edge
      LR[0] = f;
    }
    else
    {
      if (nullptr != LR[1])
        return nullptr; // not an oriented manifold interior edge
      LR[1] = f;
    }
  }

  if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
    relative_face_index = 1 - relative_face_index;
  return LR[relative_face_index];
}